

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O3

bool helics::isIgnoreableCommand(ActionMessage *command)

{
  uint uVar1;
  action_t aVar2;
  
  aVar2 = command->messageAction;
  if (aVar2 < cmd_time_request) {
    uVar1 = aVar2 + cmd_disconnect;
    if (uVar1 < 0x3b) {
      if ((0x400020600001fe1U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        return true;
      }
      if ((ulong)uVar1 == 0x26) {
        if ((command->actionTime).internalTimeCode == 0x7fffffffffffffff) {
          return true;
        }
        return false;
      }
    }
    if ((aVar2 == cmd_remove_filter) || (aVar2 == cmd_remove_endpoint)) {
      return true;
    }
  }
  else if (aVar2 < cmd_warning) {
    if (((uint)(aVar2 + 0xfffffc12) < 4) && (aVar2 + 0xfffffc12 != 1)) {
      return true;
    }
    if (aVar2 == cmd_time_request) {
      return true;
    }
    if (aVar2 == cmd_remote_log) {
      return true;
    }
  }
  else if (((uint)(aVar2 + 0xffffd8fa) < 0x10) &&
          ((0xa401U >> (aVar2 + 0xffffd8fa & 0x1fU) & 1) != 0)) {
    return true;
  }
  return false;
}

Assistant:

action_message_def::action_t action() const noexcept { return messageAction; }